

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor)

{
  int iVar1;
  int iVar2;
  Expr *pEVar3;
  Select *pSVar4;
  int iVar5;
  SubstContext x;
  SubstContext local_50;
  
  pSVar4 = pSubq;
  iVar1 = 0;
  if (pWhere != (Expr *)0x0) {
    for (; pSVar4 != (Select *)0x0; pSVar4 = pSVar4->pPrior) {
      if ((pSVar4->selFlags & 0x2008) != 0) {
        return 0;
      }
    }
    iVar1 = 0;
    if (pSubq->pLimit == (Expr *)0x0) {
      iVar5 = 0;
      for (; pWhere->op == 'G'; pWhere = pWhere->pLeft) {
        iVar1 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,iCursor);
        iVar5 = iVar5 + iVar1;
      }
      iVar1 = 0;
      if (((pWhere->flags & 1) == 0) &&
         (iVar2 = sqlite3ExprIsTableConstant(pWhere,iCursor), iVar1 = iVar5, iVar2 != 0)) {
        for (; pSubq != (Select *)0x0; pSubq = pSubq->pPrior) {
          pEVar3 = sqlite3ExprDup(pParse->db,pWhere,0);
          local_50.isLeftJoin = 0;
          local_50.pEList = pSubq->pEList;
          local_50.pParse = pParse;
          local_50.iTable = iCursor;
          local_50.iNewTable = iCursor;
          pEVar3 = substExpr(&local_50,pEVar3);
          pEVar3 = sqlite3ExprAnd(pParse->db,pSubq->pWhere,pEVar3);
          pSubq->pWhere = pEVar3;
        }
        iVar1 = iVar5 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor           /* Cursor number of the subquery */
){
  Expr *pNew;
  int nChng = 0;
  Select *pX;           /* For looping over compound SELECTs in pSubq */
  if( pWhere==0 ) return 0;
  for(pX=pSubq; pX; pX=pX->pPrior){
    if( (pX->selFlags & (SF_Aggregate|SF_Recursive))!=0 ){
      testcase( pX->selFlags & SF_Aggregate );
      testcase( pX->selFlags & SF_Recursive );
      testcase( pX!=pSubq );
      return 0; /* restrictions (1) and (2) */
    }
  }
  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, iCursor);
    pWhere = pWhere->pLeft;
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) ) return 0; /* restriction 5 */
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      pSubq->pWhere = sqlite3ExprAnd(pParse->db, pSubq->pWhere, pNew);
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}